

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# best_constant.cc
# Opt level: O1

bool get_best_constant(vw *all,float *best_constant,float *best_constant_loss)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  shared_data *psVar2;
  options_i *poVar3;
  element_type *peVar4;
  int iVar5;
  typed_option<float> *ptVar6;
  bool bVar7;
  uint uVar8;
  float fVar9;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar10;
  element_type eVar11;
  float fVar12;
  float fVar13;
  string funcName;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  string local_78;
  undefined1 local_58 [16];
  element_type local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  psVar2 = all->sd;
  fVar9 = psVar2->first_observed_label;
  if (((fVar9 == 3.4028235e+38) && (!NAN(fVar9))) ||
     (psVar2 == (shared_data *)0x0 || all->loss == (loss_function *)0x0)) {
    return false;
  }
  fVar13 = (float)(~-(uint)(psVar2->second_observed_label == 3.4028235e+38) &
                  (uint)psVar2->second_observed_label);
  if ((fVar13 == fVar9) && (!NAN(fVar13) && !NAN(fVar9))) {
    return false;
  }
  fVar10 = fVar9;
  if (fVar9 <= fVar13) {
    fVar10 = fVar13;
  }
  if (fVar9 <= fVar13) {
    fVar13 = fVar9;
  }
  local_58 = ZEXT416((uint)fVar10);
  fVar12 = (float)(psVar2->weighted_labels - (double)fVar10 * psVar2->weighted_labeled_examples) /
           (fVar13 - fVar10);
  fVar9 = (float)psVar2->weighted_labeled_examples - fVar12;
  fVar10 = fVar12 + fVar9;
  if (fVar10 <= 0.0) {
    return false;
  }
  (**all->loss->_vptr_loss_function)(local_98);
  iVar5 = std::__cxx11::string::compare((char *)local_98);
  if (((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)local_98), iVar5 == 0)) ||
     (iVar5 = std::__cxx11::string::compare((char *)local_98), iVar5 == 0)) {
    fVar13 = (float)all->sd->weighted_labels / (float)all->sd->weighted_labeled_examples;
  }
  else {
    if (all->sd->is_more_than_two_labels_observed != false) {
LAB_001e9262:
      bVar7 = false;
      goto LAB_001e932c;
    }
    iVar5 = std::__cxx11::string::compare((char *)local_98);
    if (iVar5 == 0) {
      fVar13 = *(float *)(&DAT_0027ee04 + (ulong)(fVar9 <= fVar12) * 4);
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)local_98);
      if (iVar5 == 0) {
        fVar13 = 1.0;
        local_58._0_12_ = ZEXT812(0x3f800000);
        local_58._12_4_ = 0;
        if (0.0 < fVar12) {
          if (fVar9 <= 0.0) {
            fVar13 = -1.0;
          }
          else {
            fVar13 = logf(fVar9 / fVar12);
          }
        }
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)local_98);
        if (((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)local_98), iVar5 != 0))
           && (iVar5 = std::__cxx11::string::compare((char *)local_98), iVar5 != 0))
        goto LAB_001e9262;
        poVar3 = all->options;
        paVar1 = &local_78.field_2;
        local_78._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"quantile_tau","");
        iVar5 = (*poVar3->_vptr_options_i[1])(poVar3,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        if ((char)iVar5 == '\0') {
          eVar11 = 0.5;
        }
        else {
          poVar3 = all->options;
          local_78._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"quantile_tau","");
          ptVar6 = VW::config::options_i::get_typed_option<float>(poVar3,&local_78);
          peVar4 = (ptVar6->m_value).super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar4 == (element_type *)0x0) {
            eVar11 = 0.0;
          }
          else {
            eVar11 = *peVar4;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != paVar1) {
            uStack_44 = 0;
            uStack_40 = 0;
            uStack_3c = 0;
            local_48 = eVar11;
            operator_delete(local_78._M_dataplus._M_p);
            eVar11 = local_48;
          }
        }
        uVar8 = -(uint)(eVar11 * fVar10 < fVar9);
        fVar13 = (float)(~uVar8 & (uint)fVar13 | uVar8 & local_58._0_4_);
      }
    }
  }
  *best_constant = fVar13;
  if (all->sd->is_more_than_two_labels_observed == false) {
    fVar13 = 0.0;
    if (0.0 < fVar12) {
      (*all->loss->_vptr_loss_function[1])(*best_constant);
      fVar13 = fVar12 * extraout_XMM0_Da;
    }
    fVar12 = 0.0;
    *best_constant_loss = fVar13;
    if (0.0 < fVar9) {
      (*all->loss->_vptr_loss_function[1])(*best_constant,all->loss,all->sd);
      fVar12 = fVar9 * extraout_XMM0_Da_00;
    }
    fVar10 = (fVar12 + *best_constant_loss) / fVar10;
  }
  else {
    fVar10 = 1.1754944e-38;
  }
  *best_constant_loss = fVar10;
  bVar7 = true;
LAB_001e932c:
  if (local_98[0] != local_88) {
    operator_delete(local_98[0]);
    return bVar7;
  }
  return bVar7;
}

Assistant:

bool get_best_constant(vw& all, float& best_constant, float& best_constant_loss)
{
  if (all.sd->first_observed_label == FLT_MAX ||  // no non-test labels observed or function was never called
      (all.loss == nullptr) || (all.sd == nullptr))
    return false;

  float label1 = all.sd->first_observed_label;  // observed labels might be inside [sd->Min_label, sd->Max_label], so
                                                // can't use Min/Max
  float label2 = (all.sd->second_observed_label == FLT_MAX)
      ? 0
      : all.sd->second_observed_label;  // if only one label observed, second might be 0
  if (label1 > label2)
  {
    float tmp = label1;
    label1 = label2;
    label2 = tmp;
  }  // as don't use min/max - make sure label1 < label2

  float label1_cnt;
  float label2_cnt;

  if (label1 != label2)
  {
    label1_cnt = (float)(all.sd->weighted_labels - label2 * all.sd->weighted_labeled_examples) / (label1 - label2);
    label2_cnt = (float)all.sd->weighted_labeled_examples - label1_cnt;
  }
  else
    return false;

  if ((label1_cnt + label2_cnt) <= 0.)
    return false;

  auto funcName = all.loss->getType();
  if (funcName.compare("squared") == 0 || funcName.compare("Huber") == 0 || funcName.compare("classic") == 0)
    best_constant = (float)all.sd->weighted_labels / (float)(all.sd->weighted_labeled_examples);
  else if (all.sd->is_more_than_two_labels_observed)
  {
    // loss functions below don't have generic formuas for constant yet.
    return false;
  }
  else if (funcName.compare("hinge") == 0)
  {
    best_constant = label2_cnt <= label1_cnt ? -1.f : 1.f;
  }
  else if (funcName.compare("logistic") == 0)
  {
    label1 = -1.;  // override {-50, 50} to get proper loss
    label2 = 1.;

    if (label1_cnt <= 0)
      best_constant = 1.;
    else if (label2_cnt <= 0)
      best_constant = -1.;
    else
      best_constant = log(label2_cnt / label1_cnt);
  }
  else if (funcName.compare("quantile") == 0 || funcName.compare("pinball") == 0 || funcName.compare("absolute") == 0)
  {
    float tau = 0.5;

    if (all.options->was_supplied("quantile_tau"))
      tau = all.options->get_typed_option<float>("quantile_tau").value();

    float q = tau * (label1_cnt + label2_cnt);
    if (q < label2_cnt)
      best_constant = label2;
    else
      best_constant = label1;
  }
  else
    return false;

  if (!all.sd->is_more_than_two_labels_observed)
  {
    best_constant_loss = (label1_cnt > 0) ? all.loss->getLoss(all.sd, best_constant, label1) * label1_cnt : 0.0f;
    best_constant_loss += (label2_cnt > 0) ? all.loss->getLoss(all.sd, best_constant, label2) * label2_cnt : 0.0f;
    best_constant_loss /= label1_cnt + label2_cnt;
  }
  else
    best_constant_loss = FLT_MIN;

  return true;
}